

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

FArchive * operator<<(FArchive *arc,FState **state)

{
  bool bVar1;
  PClassActor *pPVar2;
  FState *pFVar3;
  DWORD DVar4;
  ulong uVar5;
  PClassActor *unaff_R15;
  PClass *myclass;
  PClass *local_20;
  
  if (arc->m_Storing == true) {
    pFVar3 = *state;
    if (pFVar3 == (FState *)0x0) {
      FArchive::UserWriteClass(arc,AActor::RegistrationInfo.MyClass);
      DVar4 = 0x7f;
    }
    else {
      if ((ulong)PClassActor::AllActorClasses.Count != 0) {
        uVar5 = 0;
        do {
          pPVar2 = PClassActor::AllActorClasses.Array[uVar5];
          if ((pFVar3 < pPVar2->OwnedStates) ||
             (pPVar2->OwnedStates + pPVar2->NumOwnedStates <= pFVar3)) {
            bVar1 = true;
          }
          else {
            bVar1 = false;
            unaff_R15 = pPVar2;
          }
          if (!bVar1) goto LAB_005466a8;
          uVar5 = uVar5 + 1;
        } while (PClassActor::AllActorClasses.Count != uVar5);
      }
      unaff_R15 = (PClassActor *)0x0;
LAB_005466a8:
      if (unaff_R15 == (PClassActor *)0x0) {
        return arc;
      }
      FArchive::UserWriteClass(arc,&unaff_R15->super_PClass);
      DVar4 = (int)((ulong)((long)*state - (long)unaff_R15->OwnedStates) >> 3) * -0x33333333;
    }
    FArchive::WriteCount(arc,DVar4);
  }
  else {
    FArchive::UserReadClass(arc,&local_20);
    pPVar2 = dyn_cast<PClassActor>((DObject *)local_20);
    DVar4 = FArchive::ReadCount(arc);
    if ((DVar4 == 0x7f) && (pPVar2 == (PClassActor *)AActor::RegistrationInfo.MyClass)) {
      pFVar3 = (FState *)0x0;
    }
    else {
      pFVar3 = pPVar2->OwnedStates + DVar4;
    }
    *state = pFVar3;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FState *&state)
{
	PClassActor *info;

	if (arc.IsStoring ())
	{
		if (state == NULL)
		{
			arc.UserWriteClass (RUNTIME_CLASS(AActor));
			arc.WriteCount (NULL_STATE_INDEX);
			return arc;
		}

		info = FState::StaticFindStateOwner (state);

		if (info != NULL)
		{
			arc.UserWriteClass (info);
			arc.WriteCount ((DWORD)(state - info->OwnedStates));
		}
		else
		{
			/* this was never working as intended.
			I_Error ("Cannot find owner for state %p:\n"
					 "%s %c%c %3d [%p] -> %p", state,
					 sprites[state->sprite].name,
					 state->GetFrame() + 'A',
					 state->GetFullbright() ? '*' : ' ',
					 state->GetTics(),
					 state->GetAction(),
					 state->GetNextState());
			*/
		}
	}
	else
	{
		PClassActor *info;
		DWORD ofs;

		arc.UserReadClass<PClassActor>(info);
		ofs = arc.ReadCount ();
		if (ofs == NULL_STATE_INDEX && info == RUNTIME_CLASS(AActor))
		{
			state = NULL;
		}
		else
		{
			state = info->OwnedStates + ofs;
		}
	}
	return arc;
}